

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

Literals * wasm::Properties::getLiterals(Literals *__return_storage_ptr__,Expression *curr)

{
  Id IVar1;
  Expression *pEVar2;
  uintptr_t uVar3;
  ulong uVar4;
  initializer_list<wasm::Literal> init;
  Literal local_48;
  
  IVar1 = curr->_id;
  pEVar2 = curr;
  while (IVar1 == RefAsId) {
    if (1 < *(int *)(pEVar2 + 1) - 1U) goto LAB_007e46d3;
    pEVar2 = (Expression *)pEVar2[1].type.id;
    IVar1 = pEVar2->_id;
  }
  if (((IVar1 - 0x29 < 0x2b) && ((0x40000000005U >> ((ulong)(IVar1 - 0x29) & 0x3f) & 1) != 0)) ||
     (IVar1 == ConstId)) {
    getLiteral(&local_48,curr);
    init._M_len = 1;
    init._M_array = &local_48;
    Literals::Literals(__return_storage_ptr__,init);
    Literal::~Literal(&local_48);
  }
  else {
LAB_007e46d3:
    if (curr->_id != TupleMakeId) {
      handle_unreachable("non-constant expression",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                         ,0x93);
    }
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 =
         0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = curr[1].type.id;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        if (curr[1].type.id <= uVar4) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        getLiteral(&local_48,*(Expression **)(*(long *)(curr + 1) + uVar4 * 8));
        SmallVector<wasm::Literal,_1UL>::push_back
                  (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,&local_48);
        Literal::~Literal(&local_48);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Literals getLiterals(const Expression* curr) {
  if (isSingleConstantExpression(curr)) {
    return {getLiteral(curr)};
  } else if (auto* tuple = curr->dynCast<TupleMake>()) {
    Literals literals;
    for (auto* op : tuple->operands) {
      literals.push_back(getLiteral(op));
    }
    return literals;
  } else {
    WASM_UNREACHABLE("non-constant expression");
  }
}